

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketHeader.cpp
# Opt level: O1

void __thiscall ki::protocol::net::PacketHeader::read_from(PacketHeader *this,istream *istream)

{
  uint8_t uVar1;
  int iVar2;
  parse_error *ppVar3;
  string local_80;
  string local_60;
  string local_40;
  
  iVar2 = std::istream::get();
  this->m_control = 0 < iVar2;
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) != 0) {
    ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "Not enough data was available to read packet header. (m_control)","");
    parse_error::parse_error(ppVar3,&local_40,INVALID_HEADER_DATA);
    __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = std::istream::get();
  this->m_opcode = uVar1;
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) == 0) {
    std::istream::ignore((long)istream);
    if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 2) == 0) {
      return;
    }
    ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "Not enough data was available to read packet header. (ignored bytes)","");
    parse_error::parse_error(ppVar3,&local_80,INVALID_HEADER_DATA);
    __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar3 = (parse_error *)__cxa_allocate_exception(0x18);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Not enough data was available to read packet header. (m_opcode)",
             "");
  parse_error::parse_error(ppVar3,&local_60,INVALID_HEADER_DATA);
  __cxa_throw(ppVar3,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PacketHeader::read_from(std::istream& istream)
	{
		m_control = istream.get() >= 1;
		if (istream.fail())
			throw parse_error("Not enough data was available to read packet header. (m_control)",
				parse_error::INVALID_HEADER_DATA);
		m_opcode = istream.get();
		if (istream.fail())
			throw parse_error("Not enough data was available to read packet header. (m_opcode)",
				parse_error::INVALID_HEADER_DATA);
		istream.ignore(2);
		if (istream.eof())
			throw parse_error("Not enough data was available to read packet header. (ignored bytes)",
				parse_error::INVALID_HEADER_DATA);
	}